

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O0

Var Js::HelperMethodWrapper12
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              ,Var arg5,Var arg6,Var arg7,Var arg8,Var arg9,Var arg10,Var arg11,Var arg12)

{
  code *pcVar1;
  anon_class_104_13_c288d471 fn;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  Var arg4_local;
  Var arg3_local;
  Var arg2_local;
  Var arg1_local;
  void *origHelperAddr_local;
  ScriptContext *scriptContext_local;
  
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xaa,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  fn.arg1 = arg1;
  fn.origHelperAddr = origHelperAddr;
  fn.arg2 = arg2;
  fn.arg3 = arg3;
  fn.arg4 = arg4;
  fn.arg5 = arg5;
  fn.arg6 = arg6;
  fn.arg7 = arg7;
  fn.arg8 = arg8;
  fn.arg9 = arg9;
  fn.arg10 = arg10;
  fn.arg11 = arg11;
  fn.arg12 = arg12;
  pvVar4 = HelperMethodWrapper<Js::HelperMethodWrapper12(Js::ScriptContext*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*,void*)::__0>
                     (scriptContext,fn);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper12(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4, Var arg5, Var arg6, Var arg7, Var arg8, Var arg9, Var arg10, Var arg11, Var arg12)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod12)origHelperAddr)(arg1, arg2, arg3, arg4, arg5, arg6, arg7, arg8, arg9, arg10, arg11, arg12);
        });
    }